

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall
amrex::DeriveRec::DeriveRec
          (DeriveRec *this,string *a_name,IndexType result_type,int nvar_derive,DeriveBoxMap box_map
          )

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  string *in_RSI;
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  *in_RDI;
  _Invoker_type in_R8;
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  *__s;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  __s = in_RDI + 1;
  memset(__s,0,0x18);
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13b0501);
  *(undefined4 *)&in_RDI[1]._M_invoker = in_EDX;
  *(undefined4 *)((long)&in_RDI[1]._M_invoker + 4) = in_ECX;
  *(undefined8 *)&in_RDI[2].super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&in_RDI[2].super__Function_base._M_functor + 8) = 0;
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::function(in_RDI,__s);
  in_RDI[3].super__Function_base._M_manager = (_Manager_type)0x0;
  in_RDI[3]._M_invoker = in_R8;
  *(undefined4 *)&in_RDI[4].super__Function_base._M_functor = 0;
  *(undefined4 *)((long)&in_RDI[4].super__Function_base._M_functor + 4) = 0;
  *(undefined8 *)((long)&in_RDI[4].super__Function_base._M_functor + 8) = 0;
  in_RDI[4].super__Function_base._M_manager = (_Manager_type)0x0;
  in_RDI[4]._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

DeriveRec::DeriveRec (const std::string&      a_name,
                      IndexType               result_type,
                      int                     nvar_derive,
                      DeriveRec::DeriveBoxMap box_map)
    :
    derive_name(a_name),
    variable_names(),
    der_type(result_type),
    n_derive(nvar_derive),
    bx_map(box_map)
{}